

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  undefined8 *puVar1;
  __pid_t _Var2;
  int *piVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  int local_9c;
  string local_98;
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_34 [2];
  int status_value;
  
  if ((this->super_DeathTestImpl).spawned_ != true) {
    return 0;
  }
  DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
  do {
    _Var2 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,local_34,0);
    if (_Var2 != -1) {
      (this->super_DeathTestImpl).status_ = local_34[0];
      return local_34[0];
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_140);
  local_120 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_120 == plVar6) {
    local_110 = *plVar6;
    lStack_108 = plVar4[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *plVar6;
  }
  local_118 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_78 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_78 == puVar7) {
    local_68 = *puVar7;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar7;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_9c = 0x44e;
  StreamableToString<int>(&local_98,&local_9c);
  uVar9 = 0xf;
  if (local_78 != &local_68) {
    uVar9 = local_68;
  }
  if (uVar9 < local_98._M_string_length + local_70) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar10 = local_98.field_2._M_allocated_capacity;
    }
    if (local_98._M_string_length + local_70 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
      goto LAB_001afebd;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
LAB_001afebd:
  local_58 = (undefined8 *)*puVar5;
  puVar1 = puVar5 + 2;
  if (local_58 == puVar1) {
    local_48 = *puVar1;
    uStack_40 = puVar5[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *puVar1;
  }
  local_50 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_c0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_c0 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar6;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_e0 == plVar6) {
    local_d0 = *plVar6;
    lStack_c8 = plVar4[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar6;
  }
  local_d8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_100._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_100._M_dataplus._M_p == psVar8) {
    local_100.field_2._M_allocated_capacity = *psVar8;
    local_100.field_2._8_8_ = plVar4[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar8;
  }
  local_100._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  DeathTestAbort(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}